

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_wd_add(lyd_node **root,ly_ctx *ctx,lys_module **modules,int mod_count,unres_data *unres,
              int options)

{
  int iVar1;
  bool bVar2;
  int local_4c;
  lys_node *plStack_48;
  int i;
  lys_node *siter;
  int options_local;
  unres_data *unres_local;
  int mod_count_local;
  lys_module **modules_local;
  ly_ctx *ctx_local;
  lyd_node **root_local;
  
  if ((root == (lyd_node **)0x0) || ((options & 0x100U) != 0)) {
    __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1d7c,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                 );
  }
  if ((*root == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    __assert_fail("*root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1d7d,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                 );
  }
  if (((options & 0x1000U) != 0) && (*root == (lyd_node *)0x0)) {
    __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1d7e,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                 );
  }
  if ((options & 0xeU) != 0) {
    return 0;
  }
  modules_local = (lys_module **)ctx;
  if (ctx == (ly_ctx *)0x0) {
    modules_local = (lys_module **)(*root)->schema->module->ctx;
  }
  if (((options & 0x10000ffU) == 0) || ((options & 1U) != 0)) {
    if ((options & 0x1000U) == 0) {
      if ((modules == (lys_module **)0x0) || (mod_count == 0)) {
        for (local_4c = 0; local_4c < *(int *)((long)modules_local + 0x3c); local_4c = local_4c + 1)
        {
          if (((*(ushort *)
                 (*(long *)(modules_local[8]->padding2 + (long)local_4c * 8 + -0x42) + 0x40) >> 7 &
               1) != 0) &&
             ((*(ushort *)
                (*(long *)(modules_local[8]->padding2 + (long)local_4c * 8 + -0x42) + 0x40) >> 6 & 1
              ) == 0)) {
            for (plStack_48 = *(lys_node **)
                               (*(long *)(modules_local[8]->padding2 + (long)local_4c * 8 + -0x42) +
                               0xa8); plStack_48 != (lys_node *)0x0; plStack_48 = plStack_48->next)
            {
              if (((plStack_48->nodetype & 0x903f) != LYS_UNKNOWN) &&
                 (iVar1 = lyd_wd_add_subtree(root,(lyd_node *)0x0,(lyd_node *)0x0,plStack_48,1,
                                             options,unres), iVar1 != 0)) {
                return 1;
              }
            }
          }
        }
      }
      else {
        for (local_4c = 0; local_4c < mod_count; local_4c = local_4c + 1) {
          for (plStack_48 = modules[local_4c]->data; plStack_48 != (lys_node *)0x0;
              plStack_48 = plStack_48->next) {
            if (((plStack_48->nodetype & 0x903f) != LYS_UNKNOWN) &&
               (iVar1 = lyd_wd_add_subtree(root,(lyd_node *)0x0,(lyd_node *)0x0,plStack_48,1,options
                                           ,unres), iVar1 != 0)) {
              return 1;
            }
          }
        }
      }
    }
    else {
      iVar1 = lyd_wd_add_subtree(root,(lyd_node *)0x0,(lyd_node *)0x0,(*root)->schema,1,options,
                                 unres);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else if ((options & 0x40U) == 0) {
    if ((options & 0x30U) == 0) {
      if ((options & 0x1000000U) == 0) {
        ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x1dc7);
        return 1;
      }
      iVar1 = lyd_wd_add_subtree(root,(lyd_node *)0x0,(lyd_node *)0x0,(*root)->schema,1,options,
                                 unres);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      if ((*root == (lyd_node *)0x0) ||
         (((*root)->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
        ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,
               "Subtree is not a single RPC/action/reply.");
        return 1;
      }
      if ((options & 0x10U) == 0) {
        plStack_48 = (*root)->schema->child;
        while( true ) {
          bVar2 = false;
          if (plStack_48 != (lys_node *)0x0) {
            bVar2 = plStack_48->nodetype != LYS_OUTPUT;
          }
          if (!bVar2) break;
          plStack_48 = plStack_48->next;
        }
      }
      else {
        plStack_48 = (*root)->schema->child;
        while( true ) {
          bVar2 = false;
          if (plStack_48 != (lys_node *)0x0) {
            bVar2 = plStack_48->nodetype != LYS_INPUT;
          }
          if (!bVar2) break;
          plStack_48 = plStack_48->next;
        }
      }
      if ((plStack_48 != (lys_node *)0x0) &&
         (iVar1 = lyd_wd_add_subtree(root,*root,*root,plStack_48,0,options,unres), iVar1 != 0)) {
        return 1;
      }
    }
  }
  else {
    if ((*root == (lyd_node *)0x0) || ((*root)->schema->nodetype != LYS_NOTIF)) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,"Subtree is not a single notification.");
      return 1;
    }
    iVar1 = lyd_wd_add_subtree(root,*root,*root,(*root)->schema,0,options,unres);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
lyd_wd_add(struct lyd_node **root, struct ly_ctx *ctx, const struct lys_module **modules, int mod_count,
           struct unres_data *unres, int options)
{
    struct lys_node *siter;
    int i;

    assert(root && !(options & LYD_OPT_ACT_NOTIF));
    assert(*root || ctx);
    assert(!(options & LYD_OPT_NOSIBLINGS) || *root);

    if (options & (LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        /* no change supposed */
        return EXIT_SUCCESS;
    }

    if (!ctx) {
        ctx = (*root)->schema->module->ctx;
    }

    if (!(options & LYD_OPT_TYPEMASK) || (options & LYD_OPT_CONFIG)) {
        if (options & LYD_OPT_NOSIBLINGS) {
            if (lyd_wd_add_subtree(root, NULL, NULL, (*root)->schema, 1, options, unres)) {
                return EXIT_FAILURE;
            }
        } else if (modules && mod_count) {
            for (i = 0; i < mod_count; ++i) {
                LY_TREE_FOR(modules[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA |
                                             LYS_USES))) {
                        continue;
                    }
                    if (lyd_wd_add_subtree(root, NULL, NULL, siter, 1, options, unres)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        } else {
            for (i = 0; i < ctx->models.used; i++) {
                /* skip not implemented and disabled modules */
                if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
                    continue;
                }
                LY_TREE_FOR(ctx->models.list[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA |
                                             LYS_USES))) {
                        continue;
                    }
                    if (lyd_wd_add_subtree(root, NULL, NULL, siter, 1, options, unres)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        }
    } else if (options & LYD_OPT_NOTIF) {
        if (!(*root) || ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single notification.");
            return EXIT_FAILURE;
        }
        if (lyd_wd_add_subtree(root, *root, *root, (*root)->schema, 0, options, unres)) {
            return EXIT_FAILURE;
        }
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) {
        if (!(*root) || !((*root)->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single RPC/action/reply.");
            return EXIT_FAILURE;
        }
        if (options & LYD_OPT_RPC) {
            for (siter = (*root)->schema->child; siter && siter->nodetype != LYS_INPUT; siter = siter->next);
        } else { /* LYD_OPT_RPCREPLY */
            for (siter = (*root)->schema->child; siter && siter->nodetype != LYS_OUTPUT; siter = siter->next);
        }
        if (siter) {
            if (lyd_wd_add_subtree(root, *root, *root, siter, 0, options, unres)) {
                return EXIT_FAILURE;
            }
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        if (lyd_wd_add_subtree(root, NULL, NULL, (*root)->schema, 1, options, unres)) {
            return EXIT_FAILURE;
        }
    } else {
        LOGINT(ctx);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}